

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

void __thiscall
GrcManager::ConvertBetweenXYAndGpoint(GrcManager *this,GrcFont *pfont,gid16 wGlyphID)

{
  vector<GdlExpression_*,_std::allocator<GdlExpression_*>_> *this_00;
  GrcSymbolTableEntry *this_01;
  int iVar1;
  GrcFont *this_02;
  __type _Var2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Symbol pGVar6;
  GdlNumericExpression *pGVar7;
  Symbol pGVar8;
  GdlObject *pGVar9;
  gid16 wGlyphID_00;
  int iVar10;
  uint nAttrID;
  bool bVar11;
  bool fOverride;
  uint local_22c;
  bool fShadowY;
  bool fShadowX;
  int munitPRx;
  GrcManager *local_220;
  int nPRx;
  GdlExpression *pexpX;
  uint local_208;
  int nY;
  int munitPRy;
  int nPRy;
  int nX;
  allocator local_1f1;
  GdlExpression *pexpGpoint;
  GdlExpression *pexpY;
  int local_1dc;
  GrcFont *local_1d8;
  Symbol local_1d0;
  GrpLineAndFile lnf;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar10 = (int)((ulong)((long)(this->m_vpsymStyles).
                               super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_vpsymStyles).
                              super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  iVar1 = 1;
  if (1 < iVar10) {
    iVar1 = iVar10;
  }
  local_1d8 = pfont;
  uVar3 = ActualForPseudo(this,wGlyphID);
  if (uVar3 == 0) {
    uVar3 = (uint)wGlyphID;
  }
  this_00 = &this->m_vpexpModified;
  nAttrID = 0;
  local_22c = (uint)wGlyphID;
  local_220 = this;
  do {
    iVar10 = iVar1;
    if ((ulong)((long)(local_220->m_vpsymGlyphAttrs).
                      super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_220->m_vpsymGlyphAttrs).
                      super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)nAttrID) {
      return;
    }
LAB_00121af5:
    while (bVar11 = iVar10 != 0, iVar10 = iVar10 + -1, bVar11) {
      this_01 = (local_220->m_vpsymGlyphAttrs).
                super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>.
                _M_impl.super__Vector_impl_data._M_start[nAttrID];
      std::__cxx11::string::string((string *)&local_50,"x",(allocator *)&lnf);
      _Var2 = std::operator==(&this_01->m_staFieldName,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      local_208 = uVar3 & 0xffff;
      if (!_Var2) goto LAB_00121e59;
      std::__cxx11::string::string((string *)&local_90,"y",(allocator *)&lnf);
      pGVar6 = GrcSymbolTableEntry::PointSisterField(this_01,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (pGVar6 != (Symbol)0x0) {
        iVar5 = pGVar6->m_nInternalID;
        lnf.m_nLinePre = -1;
        lnf.m_nLineOrig = -1;
        lnf.m_staFile._M_dataplus._M_p = (pointer)&lnf.m_staFile.field_2;
        lnf.m_staFile._M_string_length = 0;
        lnf.m_staFile.field_2._M_local_buf[0] = '\0';
        GrcGlyphAttrMatrix::Get
                  (local_220->m_pgax,(gid16)local_22c,nAttrID,&pexpX,&nPRx,&munitPRx,&fOverride,
                   &fShadowX,&lnf);
        if ((((pexpX != (GdlExpression *)0x0) &&
             (iVar4 = (*pexpX->_vptr_GdlExpression[7])(pexpX,&nX,0), (char)iVar4 != '\0')) &&
            (GrcGlyphAttrMatrix::Get
                       (local_220->m_pgax,(gid16)local_22c,iVar5,&pexpY,&nPRy,&munitPRy,&fOverride,
                        &fShadowY,&lnf), pexpY != (GdlExpression *)0x0)) &&
           (((iVar4 = (*pexpY->_vptr_GdlExpression[7])(pexpY,&nY,0), (char)iVar4 != '\0' &&
             (fShadowX == false)) && (fShadowY == false)))) {
          std::__cxx11::string::string((string *)&local_b0,"gpoint",(allocator *)&pexpGpoint);
          local_1d0 = GrcSymbolTableEntry::PointSisterField(this_01,&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          this_02 = local_1d8;
          nPRx = GrcFont::ScaledToAbsolute(local_1d8,nPRx,munitPRx);
          nPRy = GrcFont::ScaledToAbsolute(this_02,nPRy,munitPRy);
          iVar4 = nPRy;
          if (nPRy < nPRx) {
            iVar4 = nPRx;
          }
          pGVar9 = &pexpX->super_GdlObject;
          if (pexpX == (GdlExpression *)0x0) {
            pGVar9 = (GdlObject *)0x0;
          }
          iVar4 = GrcFont::GetPointAtXY(this_02,(gid16)local_208,nX,nY,iVar4,pGVar9);
          if (-1 < iVar4) {
            pGVar9 = &pexpX->super_GdlObject;
            if (pexpX == (GdlExpression *)0x0) {
              pGVar9 = (GdlObject *)0x0;
            }
            bVar11 = GrcFont::IsPointAlone(local_1d8,(gid16)local_208,iVar4,pGVar9);
            if (!bVar11) {
              pGVar7 = (GdlNumericExpression *)operator_new(0x40);
              GdlNumericExpression::GdlNumericExpression(pGVar7,iVar4);
              pexpGpoint = (GdlExpression *)pGVar7;
              GrpLineAndFile::operator=
                        ((GrpLineAndFile *)&pGVar7->field_0x8,&(pexpX->super_GdlObject).m_lnf);
              std::vector<GdlExpression_*,_std::allocator<GdlExpression_*>_>::push_back
                        (this_00,&pexpGpoint);
              GrcGlyphAttrMatrix::Set
                        (local_220->m_pgax,(gid16)local_22c,local_1d0->m_nInternalID,pexpGpoint,0,
                         munitPRx,fOverride,false,&lnf);
              GrcGlyphAttrMatrix::Set
                        (local_220->m_pgax,(gid16)local_22c,nAttrID,(GdlExpression *)0x0,0,munitPRx,
                         true,false,&lnf);
              GrcGlyphAttrMatrix::Set
                        (local_220->m_pgax,(gid16)local_22c,iVar5,(GdlExpression *)0x0,0,munitPRy,
                         true,false,&lnf);
            }
          }
        }
        goto LAB_0012227c;
      }
    }
    nAttrID = nAttrID + 1;
  } while( true );
LAB_00121e59:
  std::__cxx11::string::string((string *)&local_70,"gpoint",(allocator *)&lnf);
  _Var2 = std::operator==(&this_01->m_staFieldName,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (_Var2) {
    lnf.m_nLinePre = -1;
    lnf.m_nLineOrig = -1;
    lnf.m_staFile._M_dataplus._M_p = (pointer)&lnf.m_staFile.field_2;
    lnf.m_staFile._M_string_length = 0;
    lnf.m_staFile.field_2._M_local_buf[0] = '\0';
    GrcGlyphAttrMatrix::Get
              (local_220->m_pgax,(gid16)local_22c,nAttrID,&pexpX,&nPRx,&munitPRx,(bool *)&nY,
               &fOverride,&lnf);
    if ((pexpX != (GdlExpression *)0x0) &&
       (iVar5 = (*pexpX->_vptr_GdlExpression[7])(pexpX,&nX,0), (char)iVar5 != '\0')) {
      pGVar9 = &pexpX->super_GdlObject;
      if (pexpX == (GdlExpression *)0x0) {
        pGVar9 = (GdlObject *)0x0;
      }
      iVar5 = GrcFont::GetXYAtPoint(local_1d8,(gid16)local_208,nX,&nPRy,&munitPRy,pGVar9);
      if (iVar5 != 0) {
        std::__cxx11::string::string((string *)&local_d0,"x",(allocator *)&pexpY);
        pGVar6 = GrcSymbolTableEntry::PointSisterField(this_01,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::string((string *)&local_f0,"y",(allocator *)&pexpY);
        pGVar8 = GrcSymbolTableEntry::PointSisterField(this_01,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        local_1d0 = (Symbol)CONCAT44(local_1d0._4_4_,pGVar6->m_nInternalID);
        local_1dc = pGVar8->m_nInternalID;
        pGVar7 = (GdlNumericExpression *)operator_new(0x40);
        GdlNumericExpression::GdlNumericExpression(pGVar7,nPRy,-2);
        pexpY = (GdlExpression *)pGVar7;
        GrpLineAndFile::operator=
                  ((GrpLineAndFile *)&pGVar7->field_0x8,&(pexpX->super_GdlObject).m_lnf);
        pGVar7 = (GdlNumericExpression *)operator_new(0x40);
        GdlNumericExpression::GdlNumericExpression(pGVar7,munitPRy,-2);
        pexpGpoint = (GdlExpression *)pGVar7;
        GrpLineAndFile::operator=
                  ((GrpLineAndFile *)&pGVar7->field_0x8,&(pexpX->super_GdlObject).m_lnf);
        std::vector<GdlExpression_*,_std::allocator<GdlExpression_*>_>::push_back(this_00,&pexpY);
        std::vector<GdlExpression_*,_std::allocator<GdlExpression_*>_>::push_back
                  (this_00,&pexpGpoint);
        bVar11 = GrcGlyphAttrMatrix::Defined(local_220->m_pgax,(gid16)local_22c,(int)local_1d0,0);
        if ((bVar11) &&
           (bVar11 = GrcGlyphAttrMatrix::Defined(local_220->m_pgax,(gid16)local_22c,local_1dc,0),
           bVar11)) {
          pGVar6 = GrcSymbolTableEntry::BasePoint(this_01);
          pGVar9 = &pexpX->super_GdlObject;
          if (pexpX == (GdlExpression *)0x0) {
            pGVar9 = (GdlObject *)0x0;
          }
          std::__cxx11::string::string
                    ((string *)&local_190,"Both x/y coordinates and gpoint are defined for ",
                     (allocator *)&fShadowX);
          GrcSymbolTableEntry::FullName_abi_cxx11_(&local_130,pGVar6);
          std::__cxx11::string::string((string *)&local_150," for glyph ",(allocator *)&fShadowY);
          GdlGlyphDefn::GlyphIDString_abi_cxx11_
                    (&local_170,(GdlGlyphDefn *)(ulong)local_22c,wGlyphID_00);
          std::__cxx11::string::string((string *)&local_110,"; only gpoint will be used",&local_1f1)
          ;
          GrcErrorList::AddWarning
                    (&g_errorList,0x11a1,pGVar9,&local_190,&local_130,&local_150,&local_170,
                     &local_110);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_190);
        }
        pGVar9 = &pexpX->super_GdlObject;
        if (pexpX == (GdlExpression *)0x0) {
          pGVar9 = (GdlObject *)0x0;
        }
        bVar11 = GrcFont::IsPointAlone(local_1d8,(gid16)local_208,nX,pGVar9);
        GrcGlyphAttrMatrix::Set
                  (local_220->m_pgax,(gid16)local_22c,(int)local_1d0,pexpY,nPRx,munitPRx,nY._0_1_,
                   !bVar11,&lnf);
        GrcGlyphAttrMatrix::Set
                  (local_220->m_pgax,(gid16)local_22c,local_1dc,pexpGpoint,nPRx,munitPRx,nY._0_1_,
                   !bVar11,&lnf);
        if (bVar11) {
          GrcGlyphAttrMatrix::Set
                    (local_220->m_pgax,(gid16)local_22c,nAttrID,(GdlExpression *)0x0,0,munitPRx,true
                     ,false,&lnf);
        }
      }
    }
LAB_0012227c:
    std::__cxx11::string::~string((string *)&lnf.m_staFile);
  }
  goto LAB_00121af5;
}

Assistant:

void GrcManager::ConvertBetweenXYAndGpoint(GrcFont * pfont, gid16 wGlyphID)
{
	int cStdStyles = max(signed(m_vpsymStyles.size()), 1);
	utf16 wActual = ActualForPseudo(wGlyphID);
	if (wActual == 0)
		wActual = wGlyphID;

	for (auto iAttrID = 0U; iAttrID < m_vpsymGlyphAttrs.size(); ++iAttrID)
	{
		for (auto n = cStdStyles; n; --n)
		{
			Symbol psymAttr = m_vpsymGlyphAttrs[iAttrID];

			if (psymAttr->LastFieldIs("x"))
			{
				Symbol psymAttrX = psymAttr;
				Symbol psymAttrY = psymAttrX->PointSisterField("y");
				if (!psymAttrY)
					continue; // need both x and y to convert
				int iAttrIDx = iAttrID;
				int iAttrIDy = psymAttrY->InternalID();

				GdlExpression * pexpX;
				int nPRx;
				int munitPRx;
				bool fOverride, fShadowX, fShadowY;
				GrpLineAndFile lnf;
				m_pgax->Get(wGlyphID, iAttrIDx,
					&pexpX, &nPRx, &munitPRx, &fOverride, &fShadowX, &lnf);

				if (!pexpX)
					continue;
				int nX;
				if (!pexpX->ResolveToInteger(&nX, false))
					continue;

				GdlExpression * pexpY;
				int nPRy;
				int munitPRy;
				m_pgax->Get(wGlyphID, iAttrIDy,
					&pexpY, &nPRy, &munitPRy, &fOverride, &fShadowY, &lnf);

				if (!pexpY)
					continue;
				int nY;
				if (!pexpY->ResolveToInteger(&nY, false))
					continue;

				Assert(fShadowX == fShadowY);
				if (fShadowX || fShadowY)
					continue;

				//	Find the corresponding gpoint attribute.
				Symbol psymGPoint = psymAttrX->PointSisterField("gpoint");
				Assert(psymGPoint);

				nPRx = pfont->ScaledToAbsolute(nPRx, munitPRx);
				nPRy = pfont->ScaledToAbsolute(nPRy, munitPRy);

				//	See if we can find a corresponding on-curve point.
				int nGPointValue = pfont->GetPointAtXY(wActual, nX, nY, max(nPRx, nPRy), pexpX);
				if (nGPointValue > -1 && !pfont->IsPointAlone(wActual, nGPointValue, pexpX))
				{
					//	We found one. Set the value of the gpoint field.
					GdlExpression * pexpGpoint = new GdlNumericExpression(nGPointValue);
					pexpGpoint->CopyLineAndFile(*pexpX);

					m_vpexpModified.push_back(pexpGpoint);	// so we can delete it later
					m_pgax->Set(wGlyphID, psymGPoint->InternalID(),
						pexpGpoint, 0, munitPRx, fOverride, false, lnf);

					//	Clear the x and y fields.
					m_pgax->Set(wGlyphID, iAttrIDx, NULL, 0, munitPRx, true, false, lnf);
					m_pgax->Set(wGlyphID, iAttrIDy, NULL, 0, munitPRy, true, false, lnf);

					//	Don't delete the actual expressions, because they are owned by the
					//	original assignment statements, which will delete them.
				}
			}
			else if (psymAttr->LastFieldIs("gpoint"))
			{
				Symbol psymAttrGpoint = psymAttr;

				int iAttrIDgpoint = iAttrID;
				GdlExpression * pexpGpoint;
				int nPR;
				int munitPR;
				bool fOverride, fShadow;
				GrpLineAndFile lnf;
				m_pgax->Get(wGlyphID, iAttrIDgpoint,
					&pexpGpoint, &nPR, &munitPR, &fOverride, &fShadow, &lnf);
				Assert(!fShadow);

				if (!pexpGpoint)
					continue;
				int nGPoint;
				if (!pexpGpoint->ResolveToInteger(&nGPoint, false))
					continue;

				//	Convert gpoint to x/y. On Linux gpoint will never work.
				//	It won't work on Windows either if the point comprises a single-point path,
				//	so in that case, delete the gpoint setting altogether. In other cases,
				//	leave both around, so if gpoint doesn't work, the engine can fall back
				//	to x/y.
				int mX, mY;
				if (pfont->GetXYAtPoint(wActual, nGPoint, &mX, &mY, pexpGpoint))
				{
					//	Create equivalent x/y statements.

					Symbol psymX = psymAttrGpoint->PointSisterField("x");
					Symbol psymY = psymAttrGpoint->PointSisterField("y");
					Assert(psymX);
					Assert(psymY);
					int nIDX = psymX->InternalID();
					int nIDY = psymY->InternalID();

					GdlExpression * pexpX = new GdlNumericExpression(mX, kmunitUnscaled);
					pexpX->CopyLineAndFile(*pexpGpoint);

					GdlExpression * pexpY = new GdlNumericExpression(mY, kmunitUnscaled);
					pexpY->CopyLineAndFile(*pexpGpoint);

					m_vpexpModified.push_back(pexpX);	// so we can delete them later
					m_vpexpModified.push_back(pexpY);

					if (m_pgax->Defined(wGlyphID, nIDX) && m_pgax->Defined(wGlyphID, nIDY))
					{
						Symbol psymBasePt = psymAttr->BasePoint();
						g_errorList.AddWarning(4513, pexpGpoint,
							"Both x/y coordinates and gpoint are defined for ",
							psymBasePt->FullName(),
							" for glyph ",
							GdlGlyphDefn::GlyphIDString(wGlyphID),
							"; only gpoint will be used");
					}

					bool fDeleteGpoint = pfont->IsPointAlone(wActual, nGPoint, pexpGpoint);

					// Store the new expressions as glyph attribute assignments.
					m_pgax->Set(wGlyphID, nIDX, pexpX, nPR, munitPR,
						fOverride, !fDeleteGpoint, lnf);
					m_pgax->Set(wGlyphID, nIDY, pexpY, nPR, munitPR,
						fOverride, !fDeleteGpoint, lnf);

					if (fDeleteGpoint)
					{
						//	Since this is a single-point path, it won't show up in the
						//	hinted glyph from the graphics object, so we really have to
						//	use the x/y coordinates. So clear the gpoint field.
						m_pgax->Set(wGlyphID, iAttrIDgpoint, NULL, 0, munitPR, true, false, lnf);
					}

					//	Don't delete the actual expression, because it is owned by the
					//	original assignment statements, which will delete it.
				}
			}
		}
	}
}